

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void xmlParseAttributeListDecl(xmlParserCtxtPtr ctxt)

{
  attributeDeclSAXFunc p_Var1;
  xmlChar *value;
  int iVar2;
  int iVar3;
  int iVar4;
  xmlChar *pxVar5;
  xmlChar *pxVar6;
  xmlParserInputPtr pxVar7;
  xmlParserErrors code;
  xmlChar xVar8;
  xmlEnumerationPtr tree;
  xmlChar *defaultValue;
  char *pcVar9;
  xmlEnumerationPtr local_48;
  int local_3c;
  xmlChar *local_38;
  
  pxVar7 = ctxt->input;
  pxVar5 = pxVar7->cur;
  if ((*pxVar5 == '<') && (pxVar5[1] == '!')) {
    pxVar6 = pxVar5 + 2;
    pxVar7->cur = pxVar6;
    pxVar7->col = pxVar7->col + 2;
    xVar8 = pxVar5[2];
    if (xVar8 == '\0') {
      xmlParserGrow(ctxt);
      pxVar7 = ctxt->input;
      pxVar6 = pxVar7->cur;
      xVar8 = *pxVar6;
    }
    if ((((xVar8 == 'A') && (pxVar6[1] == 'T')) && (pxVar6[2] == 'T')) &&
       (((pxVar6[3] == 'L' && (pxVar6[4] == 'I')) && ((pxVar6[5] == 'S' && (pxVar6[6] == 'T')))))) {
      local_3c = pxVar7->id;
      pxVar7->cur = pxVar6 + 7;
      pxVar7->col = pxVar7->col + 7;
      if (pxVar6[7] == '\0') {
        xmlParserGrow(ctxt);
      }
      iVar2 = xmlSkipBlankCharsPE(ctxt);
      if (iVar2 == 0) {
        xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_SPACE_REQUIRED,XML_ERR_FATAL,
                   (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                   "Space required after \'<!ATTLIST\'\n");
      }
      pxVar5 = xmlParseName(ctxt);
      if (pxVar5 != (xmlChar *)0x0) {
        xmlSkipBlankCharsPE(ctxt);
        do {
          pxVar7 = ctxt->input;
          if (((pxVar7->flags & 0x40) == 0) && ((long)pxVar7->end - (long)pxVar7->cur < 0xfa)) {
            xmlParserGrow(ctxt);
            pxVar7 = ctxt->input;
          }
          if ((*pxVar7->cur == '>') || (1 < ctxt->disableSAX)) goto LAB_001392f0;
          local_38 = (xmlChar *)0x0;
          if (((pxVar7->flags & 0x40) == 0) && ((long)pxVar7->end - (long)pxVar7->cur < 0xfa)) {
            xmlParserGrow(ctxt);
          }
          local_48 = (xmlEnumerationPtr)0x0;
          pxVar6 = xmlParseName(ctxt);
          if (pxVar6 == (xmlChar *)0x0) {
            pcVar9 = "ATTLIST: no name for Attribute\n";
            code = XML_ERR_NAME_REQUIRED;
LAB_00139229:
            xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,code,XML_ERR_FATAL,(xmlChar *)0x0,
                       (xmlChar *)0x0,(xmlChar *)0x0,0,"%s",pcVar9);
            goto LAB_001392ec;
          }
          pxVar7 = ctxt->input;
          if (((pxVar7->flags & 0x40) == 0) && ((long)pxVar7->end - (long)pxVar7->cur < 0xfa)) {
            xmlParserGrow(ctxt);
          }
          iVar2 = xmlSkipBlankCharsPE(ctxt);
          if (iVar2 == 0) {
            pcVar9 = "Space required after the attribute name\n";
            code = XML_ERR_SPACE_REQUIRED;
            goto LAB_00139229;
          }
          iVar2 = xmlParseAttributeType(ctxt,&local_48);
          if (iVar2 < 1) goto LAB_001392ec;
          pxVar7 = ctxt->input;
          if (((pxVar7->flags & 0x40) == 0) && ((long)pxVar7->end - (long)pxVar7->cur < 0xfa)) {
            xmlParserGrow(ctxt);
          }
          iVar3 = xmlSkipBlankCharsPE(ctxt);
          if (iVar3 == 0) {
            xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_SPACE_REQUIRED,XML_ERR_FATAL,
                       (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                       "Space required after the attribute type\n");
            goto LAB_001392dd;
          }
          iVar3 = xmlParseDefaultDecl(ctxt,&local_38);
          value = local_38;
          if (local_38 != (xmlChar *)0x0 && iVar2 != 1) {
            xmlAttrNormalizeSpace(local_38,local_38);
          }
          pxVar7 = ctxt->input;
          if (((pxVar7->flags & 0x40) == 0) && ((long)pxVar7->end - (long)pxVar7->cur < 0xfa)) {
            xmlParserGrow(ctxt);
            pxVar7 = ctxt->input;
          }
          if ((*pxVar7->cur != '>') && (iVar4 = xmlSkipBlankCharsPE(ctxt), iVar4 == 0)) {
            xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_SPACE_REQUIRED,XML_ERR_FATAL,
                       (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                       "Space required after the attribute default value\n");
            if (value != (xmlChar *)0x0) {
              (*xmlFree)(value);
            }
LAB_001392dd:
            if (local_48 != (xmlEnumerationPtr)0x0) {
              xmlFreeEnumeration(local_48);
            }
LAB_001392ec:
            pxVar7 = ctxt->input;
LAB_001392f0:
            if (*pxVar7->cur != '>') {
              return;
            }
            if (local_3c != pxVar7->id) {
              xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_ENTITY_BOUNDARY,XML_ERR_FATAL,
                         (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                         "Attribute list declaration doesn\'t start and stop in the same entity\n");
            }
            xmlNextChar(ctxt);
            return;
          }
          if (((ctxt->sax == (_xmlSAXHandler *)0x0) || (ctxt->disableSAX != 0)) ||
             (p_Var1 = ctxt->sax->attributeDecl, p_Var1 == (attributeDeclSAXFunc)0x0)) {
            if (local_48 != (xmlEnumerationPtr)0x0) {
              xmlFreeEnumeration(local_48);
            }
          }
          else {
            (*p_Var1)(ctxt->userData,pxVar5,pxVar6,iVar2,iVar3,value,local_48);
          }
          iVar4 = ctxt->sax2;
          if (iVar3 - 4U < 0xfffffffe && (iVar4 != 0 && value != (xmlChar *)0x0)) {
            xmlAddDefAttrs(ctxt,pxVar5,pxVar6,value);
            iVar4 = ctxt->sax2;
          }
          if (iVar4 != 0) {
            xmlAddSpecialAttr(ctxt,pxVar5,pxVar6,iVar2);
          }
          if (value != (xmlChar *)0x0) {
            (*xmlFree)(value);
          }
        } while( true );
      }
      xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_NAME_REQUIRED,XML_ERR_FATAL,
                 (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                 "ATTLIST: no name for Element\n");
    }
  }
  return;
}

Assistant:

void
xmlParseAttributeListDecl(xmlParserCtxtPtr ctxt) {
    const xmlChar *elemName;
    const xmlChar *attrName;
    xmlEnumerationPtr tree;

    if ((CUR != '<') || (NXT(1) != '!'))
        return;
    SKIP(2);

    if (CMP7(CUR_PTR, 'A', 'T', 'T', 'L', 'I', 'S', 'T')) {
	int inputid = ctxt->input->id;

	SKIP(7);
	if (SKIP_BLANKS_PE == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
		                 "Space required after '<!ATTLIST'\n");
	}
        elemName = xmlParseName(ctxt);
	if (elemName == NULL) {
	    xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
			   "ATTLIST: no name for Element\n");
	    return;
	}
	SKIP_BLANKS_PE;
	GROW;
	while ((RAW != '>') && (PARSER_STOPPED(ctxt) == 0)) {
	    int type;
	    int def;
	    xmlChar *defaultValue = NULL;

	    GROW;
            tree = NULL;
	    attrName = xmlParseName(ctxt);
	    if (attrName == NULL) {
		xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
			       "ATTLIST: no name for Attribute\n");
		break;
	    }
	    GROW;
	    if (SKIP_BLANKS_PE == 0) {
		xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
		        "Space required after the attribute name\n");
		break;
	    }

	    type = xmlParseAttributeType(ctxt, &tree);
	    if (type <= 0) {
	        break;
	    }

	    GROW;
	    if (SKIP_BLANKS_PE == 0) {
		xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			       "Space required after the attribute type\n");
	        if (tree != NULL)
		    xmlFreeEnumeration(tree);
		break;
	    }

	    def = xmlParseDefaultDecl(ctxt, &defaultValue);
	    if (def <= 0) {
                if (defaultValue != NULL)
		    xmlFree(defaultValue);
	        if (tree != NULL)
		    xmlFreeEnumeration(tree);
	        break;
	    }
	    if ((type != XML_ATTRIBUTE_CDATA) && (defaultValue != NULL))
	        xmlAttrNormalizeSpace(defaultValue, defaultValue);

	    GROW;
            if (RAW != '>') {
		if (SKIP_BLANKS_PE == 0) {
		    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			"Space required after the attribute default value\n");
		    if (defaultValue != NULL)
			xmlFree(defaultValue);
		    if (tree != NULL)
			xmlFreeEnumeration(tree);
		    break;
		}
	    }
	    if ((ctxt->sax != NULL) && (!ctxt->disableSAX) &&
		(ctxt->sax->attributeDecl != NULL))
		ctxt->sax->attributeDecl(ctxt->userData, elemName, attrName,
	                        type, def, defaultValue, tree);
	    else if (tree != NULL)
		xmlFreeEnumeration(tree);

	    if ((ctxt->sax2) && (defaultValue != NULL) &&
	        (def != XML_ATTRIBUTE_IMPLIED) &&
		(def != XML_ATTRIBUTE_REQUIRED)) {
		xmlAddDefAttrs(ctxt, elemName, attrName, defaultValue);
	    }
	    if (ctxt->sax2) {
		xmlAddSpecialAttr(ctxt, elemName, attrName, type);
	    }
	    if (defaultValue != NULL)
	        xmlFree(defaultValue);
	    GROW;
	}
	if (RAW == '>') {
	    if (inputid != ctxt->input->id) {
		xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                               "Attribute list declaration doesn't start and"
                               " stop in the same entity\n");
	    }
	    NEXT;
	}
    }
}